

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# amd_preprocess.c
# Opt level: O0

void amd_l_preprocess(longlong n,longlong *Ap,longlong *Ai,longlong *Rp,longlong *Ri,longlong *W,
                     longlong *Flag)

{
  long lVar1;
  long lVar2;
  long lVar3;
  longlong p2;
  longlong p;
  longlong j;
  longlong i;
  longlong *W_local;
  longlong *Ri_local;
  longlong *Rp_local;
  longlong *Ai_local;
  longlong *Ap_local;
  longlong n_local;
  
  for (i = 0; i < n; i = i + 1) {
    W[i] = 0;
    Flag[i] = -1;
  }
  for (j = 0; j < n; j = j + 1) {
    lVar1 = Ap[j + 1];
    for (p = Ap[j]; p < lVar1; p = p + 1) {
      lVar2 = Ai[p];
      if (Flag[lVar2] != j) {
        W[lVar2] = W[lVar2] + 1;
        Flag[lVar2] = j;
      }
    }
  }
  *Rp = 0;
  for (i = 0; i < n; i = i + 1) {
    Rp[i + 1] = Rp[i] + W[i];
  }
  for (i = 0; i < n; i = i + 1) {
    W[i] = Rp[i];
    Flag[i] = -1;
  }
  for (j = 0; j < n; j = j + 1) {
    lVar1 = Ap[j + 1];
    for (p = Ap[j]; p < lVar1; p = p + 1) {
      lVar2 = Ai[p];
      if (Flag[lVar2] != j) {
        lVar3 = W[lVar2];
        W[lVar2] = lVar3 + 1;
        Ri[lVar3] = j;
        Flag[lVar2] = j;
      }
    }
  }
  return;
}

Assistant:

GLOBAL void AMD_preprocess
(
    Int n,		/* input matrix: A is n-by-n */
    const Int Ap [ ],	/* size n+1 */
    const Int Ai [ ],	/* size nz = Ap [n] */

    /* output matrix R: */
    Int Rp [ ],		/* size n+1 */
    Int Ri [ ],		/* size nz (or less, if duplicates present) */

    Int W [ ],		/* workspace of size n */
    Int Flag [ ]	/* workspace of size n */
)
{

    /* --------------------------------------------------------------------- */
    /* local variables */
    /* --------------------------------------------------------------------- */

    Int i, j, p, p2 ;

    ASSERT (AMD_valid (n, n, Ap, Ai) != AMD_INVALID) ;

    /* --------------------------------------------------------------------- */
    /* count the entries in each row of A (excluding duplicates) */
    /* --------------------------------------------------------------------- */

    for (i = 0 ; i < n ; i++)
    {
	W [i] = 0 ;		/* # of nonzeros in row i (excl duplicates) */
	Flag [i] = EMPTY ;	/* Flag [i] = j if i appears in column j */
    }
    for (j = 0 ; j < n ; j++)
    {
	p2 = Ap [j+1] ;
	for (p = Ap [j] ; p < p2 ; p++)
	{
	    i = Ai [p] ;
	    if (Flag [i] != j)
	    {
		/* row index i has not yet appeared in column j */
		W [i]++ ;	    /* one more entry in row i */
		Flag [i] = j ;	    /* flag row index i as appearing in col j*/
	    }
	}
    }

    /* --------------------------------------------------------------------- */
    /* compute the row pointers for R */
    /* --------------------------------------------------------------------- */

    Rp [0] = 0 ;
    for (i = 0 ; i < n ; i++)
    {
	Rp [i+1] = Rp [i] + W [i] ;
    }
    for (i = 0 ; i < n ; i++)
    {
	W [i] = Rp [i] ;
	Flag [i] = EMPTY ;
    }

    /* --------------------------------------------------------------------- */
    /* construct the row form matrix R */
    /* --------------------------------------------------------------------- */

    /* R = row form of pattern of A */
    for (j = 0 ; j < n ; j++)
    {
	p2 = Ap [j+1] ;
	for (p = Ap [j] ; p < p2 ; p++)
	{
	    i = Ai [p] ;
	    if (Flag [i] != j)
	    {
		/* row index i has not yet appeared in column j */
		Ri [W [i]++] = j ;  /* put col j in row i */
		Flag [i] = j ;	    /* flag row index i as appearing in col j*/
	    }
	}
    }

#ifndef NDEBUG
    ASSERT (AMD_valid (n, n, Rp, Ri) == AMD_OK) ;
    for (j = 0 ; j < n ; j++)
    {
	ASSERT (W [j] == Rp [j+1]) ;
    }
#endif
}